

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowNaiveAggregator::WindowNaiveAggregator
          (WindowNaiveAggregator *this,WindowAggregateExecutor *executor,
          WindowSharedExpressions *shared)

{
  BoundWindowExpression *pBVar1;
  pointer pBVar2;
  iterator __position;
  column_t in_RAX;
  BoundOrderByNode *order;
  pointer pBVar3;
  column_t local_38;
  
  local_38 = in_RAX;
  WindowAggregator::WindowAggregator
            (&this->super_WindowAggregator,(executor->super_WindowExecutor).wexpr,shared);
  (this->super_WindowAggregator)._vptr_WindowAggregator =
       (_func_int **)&PTR__WindowNaiveAggregator_019cbc48;
  this->executor = executor;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar1 = (this->super_WindowAggregator).wexpr;
  pBVar3 = (pBVar1->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (pBVar1->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar2) {
    do {
      local_38 = WindowSharedExpressions::RegisterExpr(&pBVar3->expression,&shared->coll_shared);
      __position._M_current =
           (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->arg_order_idx,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != pBVar2);
  }
  return;
}

Assistant:

WindowNaiveAggregator::WindowNaiveAggregator(const WindowAggregateExecutor &executor, WindowSharedExpressions &shared)
    : WindowAggregator(executor.wexpr, shared), executor(executor) {

	for (const auto &order : wexpr.arg_orders) {
		arg_order_idx.emplace_back(shared.RegisterCollection(order.expression, false));
	}
}